

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxInFinalScript
          (Psbt *this,uint32_t index,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script)

{
  pointer pBVar1;
  ByteData *pBVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  CfdException *pCVar6;
  undefined4 in_register_00000034;
  pointer __x;
  ByteData *bytedata;
  bool is_witness;
  int ret;
  wally_tx_witness_stack *stacks;
  value_type last_stack;
  ByteData script;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script script_sig;
  Script redeem_script;
  TxOut utxo;
  bool local_2f9;
  int local_2f8;
  uint32_t local_2f4;
  Pubkey local_2f0;
  Script local_2d8;
  void *local_2a0;
  Script local_298;
  Script local_260;
  _func_int **local_228;
  ByteData local_220;
  KeyData local_208;
  Script local_b8;
  AbstractTxOut local_80;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x974,"SetTxInFinalScript");
  if ((unlocking_script->
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (unlocking_script->
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_208.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    local_208.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x979;
    local_208.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
    logger::log<>((CfdSourceLocation *)&local_208,kCfdLogLevelWarning,"unlocking script is empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_208.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_208.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"psbt unlocking script is empty.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_208);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_2a0 = this->wally_psbt_pointer_;
  local_2f9 = false;
  GetTxInRedeemScript(&local_b8,this,index,true,(bool *)0x0);
  local_2f4 = index;
  GetTxInUtxo((TxOut *)&local_80,this,index,true,&local_2f9);
  if (local_2f9 == true) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8,
               &(unlocking_script->
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                _M_impl.super__Vector_impl_data._M_finish[-1].data_);
    Script::GetData((ByteData *)&local_208,&local_b8);
    bVar3 = ByteData::Equals((ByteData *)&local_208,(ByteData *)&local_2d8);
    if (local_208.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (!bVar3) {
      bVar4 = Pubkey::IsValid((ByteData *)&local_2d8);
      if (!bVar4) {
        local_208.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        local_208.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x98a;
        local_208.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
        logger::log<>((CfdSourceLocation *)&local_208,kCfdLogLevelWarning,
                      "invalid unlocking_script.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_208.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_208.pubkey_.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,"psbt invalid unlocking_script error.","");
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_208);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    local_2f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8 = wally_tx_witness_stack_init_alloc
                          (((long)(unlocking_script->
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(unlocking_script->
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
    if (local_2f8 != 0) {
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x992;
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
      logger::log<int&>((CfdSourceLocation *)&local_208,kCfdLogLevelWarning,
                        "wally_tx_witness_stack_init_alloc NG[{}]",&local_2f8);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_208.pubkey_.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,"psbt init witness stack error.","");
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_208);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __x = (unlocking_script->
          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pBVar1 = (unlocking_script->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_2f8 = 0;
    if (__x != pBVar1) {
      local_2f8 = 0;
      do {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_298,&__x->data_);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_260,
                           (ByteData *)&local_298);
        local_2f8 = wally_tx_witness_stack_add
                              (local_2f0.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,local_260._vptr_Script,
                               (long)local_260.script_data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                               (long)local_260._vptr_Script);
        if (local_2f8 != 0) {
          wally_tx_witness_stack_free
                    (local_2f0.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          local_208.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
          local_208.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0x99c;
          local_208.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
          logger::log<int&>((CfdSourceLocation *)&local_208,kCfdLogLevelWarning,
                            "wally_tx_witness_stack_add NG[{}]",&local_2f8);
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          local_208.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_208.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,"psbt add witness stack error.","");
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_208);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_260._vptr_Script != (_func_int **)0x0) {
          operator_delete(local_260._vptr_Script);
        }
        if (local_298._vptr_Script != (_func_int **)0x0) {
          operator_delete(local_298._vptr_Script);
        }
        __x = __x + 1;
      } while (__x != pBVar1);
    }
    local_2f8 = wally_psbt_input_set_final_witness
                          ((ulong)local_2f4 * 0x110 + *(long *)((long)local_2a0 + 0x10),
                           local_2f0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    wally_tx_witness_stack_free
              (local_2f0.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_2f8 != 0) {
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x9a6;
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
      logger::log<int&>((CfdSourceLocation *)&local_208,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_witness NG[{}]",&local_2f8);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_208.pubkey_.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,"psbt set witness script error.","");
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_208);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_2d8._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_2d8._vptr_Script);
    }
  }
  else {
    Script::Script((Script *)&local_208);
    bytedata = (unlocking_script->
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
               _M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (unlocking_script->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pBVar2 - (long)bytedata == 0x18) {
      Script::Script(&local_2d8,bytedata);
      Script::operator=((Script *)&local_208,&local_2d8);
      Script::~Script(&local_2d8);
    }
    else {
      local_228 = (_func_int **)&PTR__ScriptBuilder_0025a9c8;
      local_298._vptr_Script = (_func_int **)&PTR__ScriptBuilder_0025a9c8;
      local_298.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bytedata != pBVar2) {
        do {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8,
                     &bytedata->data_);
          ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_260,
                             (ByteData *)&local_2d8);
          if ((long)local_260.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)local_260._vptr_Script == 1) {
            ScriptBuilder::AppendOperator
                      ((ScriptBuilder *)&local_298,(uint)*(byte *)local_260._vptr_Script);
          }
          else {
            ScriptBuilder::AppendData((ScriptBuilder *)&local_298,(ByteData *)&local_2d8);
          }
          if (local_260._vptr_Script != (_func_int **)0x0) {
            operator_delete(local_260._vptr_Script);
          }
          if (local_2d8._vptr_Script != (_func_int **)0x0) {
            operator_delete(local_2d8._vptr_Script);
          }
          bytedata = bytedata + 1;
        } while (bytedata != pBVar2);
      }
      ScriptBuilder::Build(&local_2d8,(ScriptBuilder *)&local_298);
      Script::operator=((Script *)&local_208,&local_2d8);
      Script::~Script(&local_2d8);
      local_298._vptr_Script = local_228;
      if (local_298.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    Script::GetData((ByteData *)&local_2d8,(Script *)&local_208);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_298,
                       (ByteData *)&local_2d8);
    if (local_2d8._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_2d8._vptr_Script);
    }
    local_2f8 = wally_psbt_input_set_final_scriptsig
                          ((ulong)local_2f4 * 0x110 + *(long *)((long)local_2a0 + 0x10),
                           local_298._vptr_Script,
                           (long)local_298.script_data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start -
                           (long)local_298._vptr_Script);
    if (local_2f8 != 0) {
      local_2d8._vptr_Script = (_func_int **)0x21e190;
      local_2d8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9be;
      local_2d8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = "SetTxInFinalScript";
      logger::log<int&>((CfdSourceLocation *)&local_2d8,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_scriptsig NG[{}]",&local_2f8);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_2d8._vptr_Script =
           (_func_int **)
           &local_2d8.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d8,"psbt set scriptsig error.","");
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_2d8);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_298._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_298._vptr_Script);
    }
    Script::~Script((Script *)&local_208);
    bVar3 = false;
  }
  bVar4 = local_2f9;
  if (local_2f9 == true) {
    AbstractTxOut::GetLockingScript(&local_2d8,&local_80);
    bVar5 = Script::IsP2shScript(&local_2d8);
  }
  else {
    bVar5 = false;
  }
  if (bVar4 != false) {
    Script::~Script(&local_2d8);
  }
  if (bVar5 != false) {
    Script::Script(&local_298);
    if (bVar3 == false) {
      bVar3 = Script::IsEmpty(&local_b8);
      if (bVar3) {
        GetTxInKeyData(&local_208,this,local_2f4,true);
        KeyData::GetPubkey(&local_2f0,&local_208);
        ScriptUtil::CreateP2wpkhLockingScript(&local_260,&local_2f0);
        Script::operator=(&local_298,&local_260);
        Script::~Script(&local_260);
        if (local_2f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2f0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        KeyData::~KeyData(&local_208);
      }
      else {
        Script::operator=(&local_298,&local_b8);
      }
    }
    else {
      ScriptUtil::CreateP2wshLockingScript((Script *)&local_208,&local_b8);
      Script::operator=(&local_298,(Script *)&local_208);
      Script::~Script((Script *)&local_208);
    }
    local_260._vptr_Script = (_func_int **)&PTR__ScriptBuilder_0025a9c8;
    local_260.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_260.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Script::GetData((ByteData *)&local_208,&local_298);
    ScriptBuilder::AppendData((ScriptBuilder *)&local_260,(ByteData *)&local_208);
    if (local_208.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ScriptBuilder::Build((Script *)&local_208,(ScriptBuilder *)&local_260);
    Script::GetData(&local_220,(Script *)&local_208);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f0,
                       &local_220);
    if (local_220.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Script::~Script((Script *)&local_208);
    local_2f8 = wally_psbt_input_set_final_scriptsig
                          ((ulong)local_2f4 * 0x110 + *(long *)((long)local_2a0 + 0x10),
                           local_2f0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (long)local_2f0.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2f0.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_2f8 != 0) {
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x9d4;
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetTxInFinalScript";
      logger::log<int&>((CfdSourceLocation *)&local_208,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_scriptsig NG[{}]",&local_2f8);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_208.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_208.pubkey_.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,"psbt set scriptsig error.","");
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_208);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_2f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_260._vptr_Script = (_func_int **)&PTR__ScriptBuilder_0025a9c8;
    if (local_260.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Script::~Script(&local_298);
  }
  local_80._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_0025aba8;
  Script::~Script(&local_80.locking_script_);
  Script::~Script(&local_b8);
  return;
}

Assistant:

void Psbt::SetTxInFinalScript(
    uint32_t index, const std::vector<ByteData> &unlocking_script) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (unlocking_script.empty()) {
    warn(CFD_LOG_SOURCE, "unlocking script is empty.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt unlocking script is empty.");
  }
  bool is_witness = false;
  auto redeem_script = GetTxInRedeemScript(index, true);

  auto utxo = GetTxInUtxo(index, true, &is_witness);
  bool is_wsh = false;
  int ret;
  if (is_witness) {
    auto last_stack = unlocking_script.back();
    if (redeem_script.GetData().Equals(last_stack)) {
      is_wsh = true;
    } else if (Pubkey::IsValid(last_stack)) {
      // p2wpkh
    } else {
      warn(CFD_LOG_SOURCE, "invalid unlocking_script.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid unlocking_script error.");
    }

    struct wally_tx_witness_stack *stacks = nullptr;
    ret = wally_tx_witness_stack_init_alloc(unlocking_script.size(), &stacks);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_init_alloc NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt init witness stack error.");
    }
    for (auto script : unlocking_script) {
      auto script_val = script.GetBytes();
      ret = wally_tx_witness_stack_add(
          stacks, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        wally_tx_witness_stack_free(stacks);
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_add NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness stack error.");
      }
    }

    ret = wally_psbt_input_set_final_witness(
        &psbt_pointer->inputs[index], stacks);
    wally_tx_witness_stack_free(stacks);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_witness NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set witness script error.");
    }
  } else {
    Script script_sig;
    if (unlocking_script.size() == 1) {
      script_sig = Script(unlocking_script[0]);
    } else {
      ScriptBuilder build;
      for (auto script : unlocking_script) {
        auto script_val = script.GetBytes();
        if (script_val.size() == 1) {
          build.AppendOperator(static_cast<ScriptType>(script_val[0]));
        } else {
          build.AppendData(script);
        }
      }
      script_sig = build.Build();
    }
    auto sig_val = script_sig.GetData().GetBytes();
    ret = wally_psbt_input_set_final_scriptsig(
        &psbt_pointer->inputs[index], sig_val.data(), sig_val.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set scriptsig error.");
    }
  }

  if (is_witness && utxo.GetLockingScript().IsP2shScript()) {
    Script locking_script;
    if (is_wsh) {
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
    } else if (redeem_script.IsEmpty()) {
      auto key = GetTxInKeyData(index, true);
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(key.GetPubkey());
    } else {
      locking_script = redeem_script;  // p2wpkh locking script
    }
    ScriptBuilder builder;
    builder.AppendData(locking_script.GetData());
    auto sig_val = builder.Build().GetData().GetBytes();
    ret = wally_psbt_input_set_final_scriptsig(
        &psbt_pointer->inputs[index], sig_val.data(), sig_val.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set scriptsig error.");
    }
  }
}